

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version.cpp
# Opt level: O3

bool __thiscall setup::version::is_ambiguous(version *this)

{
  version_constant vVar1;
  
  vVar1 = this->value;
  if ((int)vVar1 < 0x5040200) {
    if ((int)vVar1 < 0x3000300) {
      if ((vVar1 != 0x1031500) && (vVar1 != 0x2000100)) {
        return false;
      }
    }
    else if (((vVar1 != 0x3000300) && (vVar1 != 0x4020300)) && (vVar1 != 0x5030a00)) {
      return false;
    }
  }
  else if (((1 < vVar1 + 0xfafaf900) && (vVar1 != 0x5040200)) && (vVar1 != 0x5050000)) {
    return false;
  }
  return true;
}

Assistant:

bool version::is_ambiguous() const {
	
	if(value == INNO_VERSION(1, 3, 21)) {
		// might be either 1.3.21 or 1.3.24
		return true;
	}
	
	if(value == INNO_VERSION(2, 0, 1)) {
		// might be either 2.0.1 or 2.0.2
		return true;
	}
	
	if(value == INNO_VERSION(3, 0, 3)) {
		// might be either 3.0.3 or 3.0.4
		return true;
	}
	
	if(value == INNO_VERSION(4, 2, 3)) {
		// might be either 4.2.3 or 4.2.4
		return true;
	}
	
	if(value == INNO_VERSION(5, 3, 10)) {
		// might be either 5.3.10 or 5.3.10.1
		return true;
	}
	
	if(value == INNO_VERSION(5, 4, 2)) {
		// might be either 5.4.2 or 5.4.2.1
		return true;
	}
	
	if(value == INNO_VERSION(5, 5, 0)) {
		// might be either 5.5.0 or 5.5.0.1
		return true;
	}
	
	if(value == INNO_VERSION(5, 5, 7) || value == INNO_VERSION_EXT(5, 5, 7, 1)) {
		// might be either 5.5.7, an unknown modification of 5.5.7, or 5.6.0
		return true;
	}
	
	return false;
}